

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListOverlay.cpp
# Opt level: O1

void __thiscall cursespp::ListOverlay::KeyPress(ListOverlay *this)

{
  string *in_RSI;
  
  KeyPress((ListOverlay *)
           &this[-1].super_has_slots<sigslot::multi_threaded_local>.m_senders._M_t._M_impl.
            super__Rb_tree_header,in_RSI);
  return;
}

Assistant:

bool ListOverlay::KeyPress(const std::string& key) {
    if (keyInterceptorCallback && keyInterceptorCallback(this, key)) {
        return true;
    }
    else if (key == "^[") { /* esc closes */
        this->Dismiss();
        return true;
    }
    else if (key == " ") { /* space bar also toggles activation */
        this->OnListEntryActivated(
            this->listWindow.get(),
            this->listWindow->GetSelectedIndex());
        return true;
    }
    else if (key == "KEY_BACKSPACE" || key == "KEY_DC") {
        if (deleteKeyCallback) {
            deleteKeyCallback(
                this,
                this->adapter,
                listWindow->GetSelectedIndex());

            return true;
        }
    }

    return LayoutBase::KeyPress(key);
}